

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
EqualNode::Evaluate(string *__return_storage_ptr__,EqualNode *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *parameters,cmGeneratorExpressionContext *context,
                   GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *param_4)

{
  GeneratorExpressionContent *pGVar1;
  bool bVar2;
  int *piVar3;
  const_reference pvVar4;
  char *local_168;
  allocator local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  long local_d8;
  long rnum;
  char *rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  long local_58;
  long lnum;
  char *lhs;
  bool flipSign;
  char *pcStack_40;
  int base;
  char *pEnd;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  EqualNode *this_local;
  
  lhs._4_4_ = 0;
  lhs._3_1_ = 0;
  pEnd = (char *)param_4;
  param_4_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (EqualNode *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](parameters,0);
  lnum = std::__cxx11::string::c_str();
  bVar2 = cmHasLiteralPrefix<char_const*,3ul>((char **)&lnum,(char (*) [3])0xb08b1d);
  if ((bVar2) ||
     (bVar2 = cmHasLiteralPrefix<char_const*,3ul>((char **)&lnum,(char (*) [3])0xb08b21), bVar2)) {
    lhs._4_4_ = 2;
    lnum = lnum + 2;
  }
  bVar2 = cmHasLiteralPrefix<char_const*,4ul>((char **)&lnum,(char (*) [4])"-0b");
  if ((bVar2) ||
     (bVar2 = cmHasLiteralPrefix<char_const*,4ul>((char **)&lnum,(char (*) [4])"-0B"), bVar2)) {
    lhs._4_4_ = 2;
    lnum = lnum + 3;
    lhs._3_1_ = 1;
  }
  bVar2 = cmHasLiteralPrefix<char_const*,4ul>((char **)&lnum,(char (*) [4])"+0b");
  if ((bVar2) ||
     (bVar2 = cmHasLiteralPrefix<char_const*,4ul>((char **)&lnum,(char (*) [4])"+0B"), bVar2)) {
    lhs._4_4_ = 2;
    lnum = lnum + 3;
  }
  local_58 = strtol((char *)lnum,&stack0xffffffffffffffc0,lhs._4_4_);
  if (((pcStack_40 == (char *)lnum) || (*pcStack_40 != '\0')) ||
     (piVar3 = __errno_location(), *piVar3 == 0x22)) {
    pGVar1 = content_local;
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_78,(GeneratorExpressionContent *)param_4_local);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)context_local,0);
    std::operator+(&local_b8,"$<EQUAL> parameter ",pvVar4);
    std::operator+(&local_98,&local_b8," is not a valid integer.");
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    if ((lhs._3_1_ & 1) != 0) {
      local_58 = -local_58;
    }
    lhs._4_4_ = 0;
    lhs._3_1_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)context_local,1);
    rnum = std::__cxx11::string::c_str();
    bVar2 = cmHasLiteralPrefix<char_const*,3ul>((char **)&rnum,(char (*) [3])0xb08b1d);
    if ((bVar2) ||
       (bVar2 = cmHasLiteralPrefix<char_const*,3ul>((char **)&rnum,(char (*) [3])0xb08b21), bVar2))
    {
      lhs._4_4_ = 2;
      rnum = rnum + 2;
    }
    bVar2 = cmHasLiteralPrefix<char_const*,4ul>((char **)&rnum,(char (*) [4])"-0b");
    if ((bVar2) ||
       (bVar2 = cmHasLiteralPrefix<char_const*,4ul>((char **)&rnum,(char (*) [4])"-0B"), bVar2)) {
      lhs._4_4_ = 2;
      rnum = rnum + 3;
      lhs._3_1_ = 1;
    }
    bVar2 = cmHasLiteralPrefix<char_const*,4ul>((char **)&rnum,(char (*) [4])"+0b");
    if ((bVar2) ||
       (bVar2 = cmHasLiteralPrefix<char_const*,4ul>((char **)&rnum,(char (*) [4])"+0B"), bVar2)) {
      lhs._4_4_ = 2;
      rnum = rnum + 3;
    }
    local_d8 = strtol((char *)rnum,&stack0xffffffffffffffc0,lhs._4_4_);
    if (((pcStack_40 == (char *)rnum) || (*pcStack_40 != '\0')) ||
       (piVar3 = __errno_location(), *piVar3 == 0x22)) {
      pGVar1 = content_local;
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_f8,(GeneratorExpressionContent *)param_4_local);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)context_local,1);
      std::operator+(&local_138,"$<EQUAL> parameter ",pvVar4);
      std::operator+(&local_118,&local_138," is not a valid integer.");
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_f8,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      if ((lhs._3_1_ & 1) != 0) {
        local_d8 = -local_d8;
      }
      if (local_58 == local_d8) {
        local_168 = "1";
      }
      else {
        local_168 = "0";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_168,&local_139);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    char* pEnd;

    int base = 0;
    bool flipSign = false;

    const char* lhs = parameters[0].c_str();
    if (cmHasLiteralPrefix(lhs, "0b") || cmHasLiteralPrefix(lhs, "0B")) {
      base = 2;
      lhs += 2;
    }
    if (cmHasLiteralPrefix(lhs, "-0b") || cmHasLiteralPrefix(lhs, "-0B")) {
      base = 2;
      lhs += 3;
      flipSign = true;
    }
    if (cmHasLiteralPrefix(lhs, "+0b") || cmHasLiteralPrefix(lhs, "+0B")) {
      base = 2;
      lhs += 3;
    }

    long lnum = strtol(lhs, &pEnd, base);
    if (pEnd == lhs || *pEnd != '\0' || errno == ERANGE) {
      reportError(context, content->GetOriginalExpression(),
                  "$<EQUAL> parameter " + parameters[0] +
                    " is not a valid integer.");
      return std::string();
    }

    if (flipSign) {
      lnum = -lnum;
    }

    base = 0;
    flipSign = false;

    const char* rhs = parameters[1].c_str();
    if (cmHasLiteralPrefix(rhs, "0b") || cmHasLiteralPrefix(rhs, "0B")) {
      base = 2;
      rhs += 2;
    }
    if (cmHasLiteralPrefix(rhs, "-0b") || cmHasLiteralPrefix(rhs, "-0B")) {
      base = 2;
      rhs += 3;
      flipSign = true;
    }
    if (cmHasLiteralPrefix(rhs, "+0b") || cmHasLiteralPrefix(rhs, "+0B")) {
      base = 2;
      rhs += 3;
    }

    long rnum = strtol(rhs, &pEnd, base);
    if (pEnd == rhs || *pEnd != '\0' || errno == ERANGE) {
      reportError(context, content->GetOriginalExpression(),
                  "$<EQUAL> parameter " + parameters[1] +
                    " is not a valid integer.");
      return std::string();
    }

    if (flipSign) {
      rnum = -rnum;
    }

    return lnum == rnum ? "1" : "0";
  }